

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O2

void talismanic_reward(CHAR_DATA *ch)

{
  PC_DATA *pPVar1;
  int iVar2;
  
  if (ch->in_room->vnum == 0x23bc) {
    pPVar1 = ch->pcdata;
    pPVar1->quests[2] = 6;
    iVar2 = skill_lookup("talismanic aura");
    pPVar1->learned[iVar2] = 0x46;
    return;
  }
  send_to_char("You pause briefly to reflect on all you have seen and learned in your dealings with the hermit.\n\r"
               ,ch);
  WAIT_STATE(ch,0x24);
  send_to_char("You feel more experienced!\n\r",ch);
  gain_exp(ch,0x1194);
  return;
}

Assistant:

void talismanic_reward(CHAR_DATA *ch)
{
	if (ch->in_room->vnum == 9148)
	{
		ch->pcdata->quests[TALISMANIC_QUEST] = 6;
		ch->pcdata->learned[skill_lookup("talismanic aura")] = 70;
	}
	else
	{
		send_to_char("You pause briefly to reflect on all you have seen and learned in your dealings with the hermit.\n\r", ch);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);

		send_to_char("You feel more experienced!\n\r", ch);
		gain_exp(ch, 4500);
	}
}